

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

void processErrorCallback(MQTT_CLIENT_HANDLE handle,MQTT_CLIENT_EVENT_ERROR error,void *callbackCtx)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  void *callbackCtx_local;
  MQTT_CLIENT_EVENT_ERROR error_local;
  MQTT_CLIENT_HANDLE handle_local;
  
  if (callbackCtx == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"processErrorCallback",0x91e,1,"Failure: mqtt called back with null context.");
    }
  }
  else {
    switch(error) {
    case MQTT_CLIENT_CONNECTION_ERROR:
      (**(code **)((long)callbackCtx + 0x130))(1,4,*(undefined8 *)((long)callbackCtx + 0x168));
      break;
    case MQTT_CLIENT_PARSE_ERROR:
    case MQTT_CLIENT_MEMORY_ERROR:
    case MQTT_CLIENT_UNKNOWN_ERROR:
    default:
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        pcVar2 = MQTT_CLIENT_EVENT_ERRORStrings(error);
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"processErrorCallback",0x8f9,1,
                  "INTERNAL ERROR: unexpected error value received %s",pcVar2);
      }
      break;
    case MQTT_CLIENT_COMMUNICATION_ERROR:
      (**(code **)((long)callbackCtx + 0x130))(1,5,*(undefined8 *)((long)callbackCtx + 0x168));
      break;
    case MQTT_CLIENT_NO_PING_RESPONSE:
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"processErrorCallback",0x8f0,1,
                  "Mqtt Ping Response was not encountered.  Reconnecting device...");
      }
      (**(code **)((long)callbackCtx + 0x130))(1,7,*(undefined8 *)((long)callbackCtx + 0x168));
    }
    if (*(int *)((long)callbackCtx + 0x88) != 3) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        pcVar2 = MQTT_CLIENT_EVENT_ERRORStrings(error);
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"processErrorCallback",0x902,1,
                  "Disconnecting MQTT connection because of an MQTT protocol error (%s).",pcVar2);
      }
      *(undefined4 *)((long)callbackCtx + 0x88) = 4;
    }
    *(undefined4 *)((long)callbackCtx + 0xf0) = 0xe1;
    *(undefined1 *)((long)callbackCtx + 0x8e) = 0;
    if (*(long *)((long)callbackCtx + 8) != 0) {
      *(uint *)((long)callbackCtx + 0x30) = *(uint *)((long)callbackCtx + 0x30) | 4;
    }
    if (*(long *)((long)callbackCtx + 0x10) != 0) {
      *(uint *)((long)callbackCtx + 0x30) = *(uint *)((long)callbackCtx + 0x30) | 1;
    }
    if (*(long *)((long)callbackCtx + 0x18) != 0) {
      *(uint *)((long)callbackCtx + 0x30) = *(uint *)((long)callbackCtx + 0x30) | 2;
    }
    if (*(long *)((long)callbackCtx + 0x28) != 0) {
      *(uint *)((long)callbackCtx + 0x30) = *(uint *)((long)callbackCtx + 0x30) | 8;
    }
    if (*(long *)((long)callbackCtx + 0x20) != 0) {
      *(uint *)((long)callbackCtx + 0x30) = *(uint *)((long)callbackCtx + 0x30) | 0x10;
    }
  }
  return;
}

Assistant:

static void processErrorCallback(MQTT_CLIENT_HANDLE handle, MQTT_CLIENT_EVENT_ERROR error, void* callbackCtx)
{
    (void)handle;
    if (callbackCtx != NULL)
    {
        PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)callbackCtx;
        switch (error)
        {
            case MQTT_CLIENT_CONNECTION_ERROR:
            {
                transport_data->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_NO_NETWORK, transport_data->transport_ctx);
                break;
            }
            case MQTT_CLIENT_COMMUNICATION_ERROR:
            {
                transport_data->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_COMMUNICATION_ERROR, transport_data->transport_ctx);
                break;
            }
            case MQTT_CLIENT_NO_PING_RESPONSE:
            {
                LogError("Mqtt Ping Response was not encountered.  Reconnecting device...");
                transport_data->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_NO_PING_RESPONSE, transport_data->transport_ctx);
                break;
            }
            case MQTT_CLIENT_PARSE_ERROR:
            case MQTT_CLIENT_MEMORY_ERROR:
            case MQTT_CLIENT_UNKNOWN_ERROR:
            default:
            {
                LogError("INTERNAL ERROR: unexpected error value received %s", MU_ENUM_TO_STRING(MQTT_CLIENT_EVENT_ERROR, error));
                break;
            }
        }
        if (transport_data->mqttClientStatus != MQTT_CLIENT_STATUS_PENDING_CLOSE)
        {
            // We have encountered an mqtt protocol error in an non-closing state
            // The best course of action is to execute a shutdown of the mqtt/tls/socket
            // layer and then attempt to reconnect
            LogError("Disconnecting MQTT connection because of an MQTT protocol error (%s).", MU_ENUM_TO_STRING(MQTT_CLIENT_EVENT_ERROR, error));
            transport_data->mqttClientStatus = MQTT_CLIENT_STATUS_EXECUTE_DISCONNECT;
        }
        transport_data->currPacketState = PACKET_TYPE_ERROR;
        transport_data->device_twin_get_sent = false;
        if (transport_data->topic_MqttMessage != NULL)
        {
            transport_data->topics_ToSubscribe |= SUBSCRIBE_TELEMETRY_TOPIC;
        }
        if (transport_data->topic_GetState != NULL)
        {
            transport_data->topics_ToSubscribe |= SUBSCRIBE_GET_REPORTED_STATE_TOPIC;
        }
        if (transport_data->topic_NotifyState != NULL)
        {
            transport_data->topics_ToSubscribe |= SUBSCRIBE_NOTIFICATION_STATE_TOPIC;
        }
        if (transport_data->topic_DeviceMethods != NULL)
        {
            transport_data->topics_ToSubscribe |= SUBSCRIBE_DEVICE_METHOD_TOPIC;
        }
        if (transport_data->topic_InputQueue != NULL)
        {
            transport_data->topics_ToSubscribe |= SUBSCRIBE_INPUT_QUEUE_TOPIC;
        }
    }
    else
    {
        LogError("Failure: mqtt called back with null context.");
    }
}